

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall
FIX::Session::nextSequenceReset(Session *this,Message *sequenceReset,UtcTimeStamp *now)

{
  SessionState *this_00;
  bool bVar1;
  int iVar2;
  IntTConvertor<unsigned_long> *pIVar3;
  uint64_t uVar4;
  SEQNUM SVar5;
  unsigned_long value;
  unsigned_long value_00;
  uchar *in_R8;
  size_t in_R9;
  string sStack_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  FieldBase local_128;
  NewSeqNo newSeqNo;
  GapFillFlag gapFillFlag;
  
  GapFillFlag::GapFillFlag(&gapFillFlag);
  bVar1 = FieldMap::getFieldIfSet(&sequenceReset->super_FieldMap,(FieldBase *)&gapFillFlag);
  if (bVar1) {
    bVar1 = BoolField::getValue(&gapFillFlag.super_BoolField);
  }
  else {
    bVar1 = false;
  }
  iVar2 = verify(this,(EVP_PKEY_CTX *)sequenceReset,(uchar *)(ulong)bVar1,(ulong)bVar1,in_R8,in_R9);
  if ((char)iVar2 != '\0') {
    NewSeqNo::NewSeqNo(&newSeqNo);
    bVar1 = FieldMap::getFieldIfSet(&sequenceReset->super_FieldMap,(FieldBase *)&newSeqNo);
    if (bVar1) {
      this_00 = &this->m_state;
      pIVar3 = (IntTConvertor<unsigned_long> *)SessionState::getNextTargetMsgSeqNum(this_00);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_188,pIVar3,value);
      std::operator+(&local_168,"Received SequenceReset FROM: ",&local_188);
      std::operator+(&local_148,&local_168," TO: ");
      pIVar3 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue(&newSeqNo.super_SeqNumField);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_(&sStack_1a8,pIVar3,value_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128
                     ,&local_148,&sStack_1a8);
      SessionState::onEvent(this_00,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&sStack_1a8);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      uVar4 = UInt64Field::getValue(&newSeqNo.super_SeqNumField);
      SVar5 = SessionState::getNextTargetMsgSeqNum(this_00);
      if (SVar5 < uVar4) {
        uVar4 = UInt64Field::getValue(&newSeqNo.super_SeqNumField);
        MsgSeqNum::MsgSeqNum((MsgSeqNum *)&local_128,uVar4);
        uVar4 = UInt64Field::getValue((UInt64Field *)&local_128);
        SessionState::setNextTargetMsgSeqNum(this_00,uVar4);
        FieldBase::~FieldBase(&local_128);
      }
      else {
        uVar4 = UInt64Field::getValue(&newSeqNo.super_SeqNumField);
        SVar5 = SessionState::getNextTargetMsgSeqNum(this_00);
        if (uVar4 < SVar5) {
          generateReject(this,sequenceReset,5,0);
        }
      }
    }
    FieldBase::~FieldBase((FieldBase *)&newSeqNo);
  }
  FieldBase::~FieldBase((FieldBase *)&gapFillFlag);
  return;
}

Assistant:

void Session::nextSequenceReset(const Message &sequenceReset, const UtcTimeStamp &now) {
  bool isGapFill = false;
  GapFillFlag gapFillFlag;
  if (sequenceReset.getFieldIfSet(gapFillFlag)) {
    isGapFill = gapFillFlag;
  }

  if (!verify(sequenceReset, isGapFill, isGapFill)) {
    return;
  }

  NewSeqNo newSeqNo;
  if (sequenceReset.getFieldIfSet(newSeqNo)) {
    m_state.onEvent(
        "Received SequenceReset FROM: " + SEQNUM_CONVERTOR::convert(getExpectedTargetNum())
        + " TO: " + SEQNUM_CONVERTOR::convert(newSeqNo));

    if (newSeqNo > getExpectedTargetNum()) {
      m_state.setNextTargetMsgSeqNum(MsgSeqNum(newSeqNo));
    } else if (newSeqNo < getExpectedTargetNum()) {
      generateReject(sequenceReset, SessionRejectReason_VALUE_IS_INCORRECT);
    }
  }
}